

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::MatrixWrapper<Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::member_sum<double>,0>const>,0>>const>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::member_sum<double>,_0>_>,_0>_>_>_>
               *src,assign_op<double,_double> *func)

{
  undefined1 (*pauVar1) [16];
  double *pdVar2;
  ulong cols;
  ulong uVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined8 *puVar6;
  long lVar7;
  Index index;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  SrcEvaluatorType srcEvaluator;
  product_evaluator<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::member_sum<double>,_0>_>,_0>,_5,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_48;
  
  pdVar2 = (((src->m_expression).m_lhs.m_xpr.m_expression)->
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  product_evaluator<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::member_sum<double>,_0>_>,_0>,_5,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator(&local_48,&(src->m_expression).m_rhs.m_expression);
  uVar8 = (src->m_expression).m_rhs.m_expression.m_lhs.m_rows.m_value;
  cols = (((src->m_expression).m_rhs.m_expression.m_rhs.m_expression.m_matrix.m_xpr.m_expression)->
         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar8) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      cols)) {
    if ((long)(cols | uVar8) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && uVar8 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)cols),0) <
        (long)uVar8)) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = std::random_device::_M_fini;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,cols * uVar8,uVar8,cols);
  }
  uVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar3 == uVar8) &&
     (uVar8 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols, uVar8 == cols)) {
    pdVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar9 = uVar8 * uVar3;
    uVar8 = lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar9) {
      lVar7 = 0;
      do {
        pauVar1 = (undefined1 (*) [16])(pdVar2 + lVar7);
        auVar15 = *pauVar1;
        auVar13 = *pauVar1;
        if (pexp<double__vector(2)>(double(int)const)::p4i_1023_0 == '\0') {
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::MatrixWrapper<Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::member_sum<double>,0>const>,0>>const>const>,Eigen::internal::assign_op<double,double>>
                    ();
        }
        auVar15 = minpd(auVar15,_DAT_00114070);
        auVar5._8_8_ = 0xc0862b7d369a5715;
        auVar5._0_8_ = 0xc0862b7d369a5715;
        auVar15 = maxpd(auVar15,auVar5);
        dVar17 = auVar15._0_8_ * 1.4426950408889634 + 0.5;
        dVar18 = auVar15._8_8_ * 1.4426950408889634 + 0.5;
        dVar10 = (double)(int)dVar17;
        dVar14 = (double)(int)dVar18;
        dVar10 = dVar10 - (double)(-(ulong)(dVar17 < dVar10) & 0x3ff0000000000000);
        dVar14 = dVar14 - (double)(-(ulong)(dVar18 < dVar14) & 0x3ff0000000000000);
        dVar19 = dVar10 * -0.693145751953125 + auVar15._0_8_ + dVar10 * -1.4286068203094173e-06;
        dVar20 = dVar14 * -0.693145751953125 + auVar15._8_8_ + dVar14 * -1.4286068203094173e-06;
        dVar17 = dVar19 * dVar19;
        dVar18 = dVar20 * dVar20;
        auVar16._0_8_ =
             ((dVar17 * 0.00012617719307481058 + 0.030299440770744195) * dVar17 + 1.0) * dVar19;
        auVar16._8_8_ =
             ((dVar18 * 0.00012617719307481058 + 0.030299440770744195) * dVar18 + 1.0) * dVar20;
        auVar15._8_8_ =
             (((dVar18 * 3.0019850513866446e-06 + 0.002524483403496841) * dVar18 +
              0.22726554820815503) * dVar18 + 2.0) - auVar16._8_8_;
        auVar15._0_8_ =
             (((dVar17 * 3.0019850513866446e-06 + 0.002524483403496841) * dVar17 +
              0.22726554820815503) * dVar17 + 2.0) - auVar16._0_8_;
        auVar15 = divpd(auVar16,auVar15);
        auVar11._0_8_ =
             (double)CONCAT44(((int)dVar10 + pexp<double__vector(2)>(double(int)const)::p4i_1023_0)
                              * 0x100000,DAT_001222ec << 0x14);
        auVar11._8_4_ = DAT_001222e8 << 0x14;
        auVar11._12_4_ = ((int)dVar14 + DAT_001222e4) * 0x100000;
        auVar12._0_8_ = auVar11._0_8_ * (auVar15._0_8_ + auVar15._0_8_ + 1.0);
        auVar12._8_8_ = auVar11._8_8_ * (auVar15._8_8_ + auVar15._8_8_ + 1.0);
        auVar13 = maxpd(auVar12,auVar13);
        auVar13 = divpd(auVar13,*(undefined1 (*) [16])
                                 (local_48.
                                  super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                  .m_data + lVar7));
        *(undefined1 (*) [16])(pdVar4 + lVar7) = auVar13;
        lVar7 = lVar7 + 2;
      } while (lVar7 < (long)uVar8);
    }
    if ((long)uVar8 < lVar9) {
      do {
        dVar10 = exp(pdVar2[uVar8]);
        pdVar4[uVar8] =
             dVar10 / local_48.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      .m_data[uVar8];
        uVar8 = uVar8 + 1;
      } while (lVar9 - uVar8 != 0);
    }
    free(local_48.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, -1>>>, const Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>, Eigen::MatrixWrapper<const Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>, const Eigen::ArrayWrapper<const Eigen::Matrix<double, -1, -1>>>, Eigen::internal::member_sum<double>, 0>>>>>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}